

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_str_remove_chars(nk_str *s,int len)

{
  int iVar1;
  int len_local;
  nk_str *s_local;
  
  if (s == (nk_str *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x214a,"void nk_str_remove_chars(struct nk_str *, int)");
  }
  if (len < 0) {
    __assert_fail("len >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x214b,"void nk_str_remove_chars(struct nk_str *, int)");
  }
  if (((s != (nk_str *)0x0) && (-1 < len)) && ((ulong)(long)len <= (s->buffer).allocated)) {
    if ((int)(s->buffer).allocated - len < 0) {
      __assert_fail("((int)s->buffer.allocated - (int)len) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x214d,"void nk_str_remove_chars(struct nk_str *, int)");
    }
    (s->buffer).allocated = (s->buffer).allocated - (long)len;
    iVar1 = nk_utf_len((char *)(s->buffer).memory.ptr,(int)(s->buffer).allocated);
    s->len = iVar1;
  }
  return;
}

Assistant:

NK_API void
nk_str_remove_chars(struct nk_str *s, int len)
{
    NK_ASSERT(s);
    NK_ASSERT(len >= 0);
    if (!s || len < 0 || (nk_size)len > s->buffer.allocated) return;
    NK_ASSERT(((int)s->buffer.allocated - (int)len) >= 0);
    s->buffer.allocated -= (nk_size)len;
    s->len = nk_utf_len((char *)s->buffer.memory.ptr, (int)s->buffer.allocated);
}